

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint64_t fletcher4(char *key,int len,uint64_t seed)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  char *pcVar9;
  
  iVar3 = len + 3;
  if (-1 < len) {
    iVar3 = len;
  }
  puVar8 = (uint *)key;
  pcVar9 = key;
  if (len < 4) {
    lVar5 = 0;
    lVar7 = 0;
    uVar4 = 0;
  }
  else {
    lVar7 = 0;
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar2 = *puVar8;
      puVar8 = puVar8 + 1;
      pcVar9 = pcVar9 + 4;
      seed = seed + uVar2;
      lVar5 = lVar5 + seed;
      lVar7 = lVar7 + lVar5;
      uVar4 = uVar4 + lVar7;
    } while (puVar8 < key + (long)(iVar3 >> 2) * 4);
  }
  if (((len & 3U) != 0) && (puVar8 < key + len)) {
    lVar6 = 0;
    do {
      pbVar1 = (byte *)((long)puVar8 + lVar6);
      lVar6 = lVar6 + 1;
      seed = seed + *pbVar1;
      lVar5 = lVar5 + seed;
      lVar7 = lVar7 + lVar5;
      uVar4 = uVar4 + lVar7;
    } while ((long)(key + len) - (long)pcVar9 != lVar6);
  }
  return uVar4;
}

Assistant:

uint64_t
fletcher4(const char *key, int len, uint64_t seed)
{
  uint32_t *dataw = (uint32_t *)key;
  const uint32_t *const endw = &((const uint32_t*)key)[len/4];
  uint64_t A = seed, B = 0, C = 0, D = 0;
  while (dataw < endw) {
    A += *dataw++;
    B += A;
    C += B;
    D += C;
  }
  if (len & 3) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (datac < endc) {
      A += *datac++;
      B += A;
      C += B;
      D += C;
    }
  }
  return D;
}